

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_max_s_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar4 = pfVar1->fs[1];
  uVar5 = pfVar1->fs[2];
  uVar6 = pfVar1->fs[3];
  pfVar2 = (env->active_fpu).fpr + wt;
  uVar7 = pfVar2->fs[1];
  uVar8 = pfVar2->fs[2];
  uVar9 = pfVar2->fs[3];
  uVar10 = -(uint)((int)pfVar2->fs[0] < (int)pfVar1->fs[0]);
  uVar11 = -(uint)((int)uVar7 < (int)uVar4);
  uVar12 = -(uint)((int)uVar8 < (int)uVar5);
  uVar13 = -(uint)((int)uVar9 < (int)uVar6);
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fs[0] = ~uVar10 & pfVar2->fs[0] | pfVar1->fs[0] & uVar10;
  pfVar3->fs[1] = ~uVar11 & uVar7 | uVar4 & uVar11;
  pfVar3->fs[2] = ~uVar12 & uVar8 | uVar5 & uVar12;
  pfVar3->fs[3] = ~uVar13 & uVar9 | uVar6 & uVar13;
  return;
}

Assistant:

void helper_msa_max_s_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_max_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_max_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_max_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_max_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}